

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4f39de::IntegerExpr::printLeft(IntegerExpr *this,OutputStream *S)

{
  char *pcVar1;
  char *pcVar2;
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  
  if (3 < (ulong)((long)(this->Type).Last - (long)(this->Type).First)) {
    R.Last = "";
    R.First = "(";
    OutputStream::operator+=(S,R);
    OutputStream::operator+=(S,this->Type);
    R_00.Last = "";
    R_00.First = ")";
    OutputStream::operator+=(S,R_00);
  }
  pcVar2 = (this->Value).First;
  if (*pcVar2 == 'n') {
    R_01.Last = "";
    R_01.First = "-";
    OutputStream::operator+=(S,R_01);
    pcVar2 = (this->Value).First;
    pcVar1 = (this->Value).Last;
    pcVar2 = pcVar2 + (pcVar1 != pcVar2);
  }
  else {
    pcVar1 = (this->Value).Last;
  }
  R_02.Last = pcVar1;
  R_02.First = pcVar2;
  OutputStream::operator+=(S,R_02);
  if ((ulong)((long)(this->Type).Last - (long)(this->Type).First) < 4) {
    OutputStream::operator+=(S,this->Type);
    return;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Type.size() > 3) {
      S += "(";
      S += Type;
      S += ")";
    }

    if (Value[0] == 'n') {
      S += "-";
      S += Value.dropFront(1);
    } else
      S += Value;

    if (Type.size() <= 3)
      S += Type;
  }